

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void calc_target_weighted_pred
               (AV1_COMMON *cm,MACROBLOCK *x,MACROBLOCKD *xd,uint8_t *above,int above_stride,
               uint8_t *left,int left_stride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  MACROBLOCKD *xd_00;
  overlappable_nb_visitor_t fun;
  MACROBLOCKD *in_RDX;
  long in_RSI;
  int col_1;
  int row_1;
  uint16_t *src_1;
  int col;
  int row;
  uint8_t *src;
  calc_target_weighted_pred_ctxt ctxt_1;
  int overlap_1;
  int i_1;
  calc_target_weighted_pred_ctxt ctxt;
  int overlap;
  int i;
  int src_scale;
  int is_hbd;
  int32_t *wsrc_buf;
  int32_t *mask_buf;
  OBMCBuffer *obmc_buffer;
  int bh;
  int bw;
  BLOCK_SIZE bsize;
  int local_c0;
  int local_bc;
  long local_b8;
  int local_b0;
  int local_ac;
  long local_a8;
  int local_84;
  int local_64;
  undefined4 uVar4;
  long lVar5;
  undefined4 in_stack_ffffffffffffffc0;
  
  iVar1 = (uint)in_RDX->width * 4;
  iVar2 = (uint)in_RDX->height << 2;
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x41a0);
  lVar5 = *(long *)(in_RSI + 0x41a8);
  fun = *(overlappable_nb_visitor_t *)xd_00;
  iVar3 = is_cur_buf_hbd(in_RDX);
  uVar4 = 0x1000;
  memset(fun,0,(long)(iVar1 * iVar2) << 2);
  for (local_64 = 0; local_64 < iVar1 * iVar2; local_64 = local_64 + 1) {
    *(undefined4 *)(lVar5 + (long)local_64 * 4) = 0x40;
  }
  if ((in_RDX->up_available & 1U) != 0) {
    foreach_overlappable_nb_above
              ((AV1_COMMON *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),xd_00,
               (int)((ulong)lVar5 >> 0x20),fun,(void *)CONCAT44(iVar3,uVar4));
  }
  for (local_84 = 0; local_84 < iVar1 * iVar2; local_84 = local_84 + 1) {
    *(int *)(fun + (long)local_84 * 4) = *(int *)(fun + (long)local_84 * 4) << 6;
    *(int *)(lVar5 + (long)local_84 * 4) = *(int *)(lVar5 + (long)local_84 * 4) << 6;
  }
  if ((in_RDX->left_available & 1U) != 0) {
    foreach_overlappable_nb_left
              ((AV1_COMMON *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),xd_00,
               (int)((ulong)lVar5 >> 0x20),fun,(void *)CONCAT44(iVar3,uVar4));
  }
  if (iVar3 == 0) {
    local_a8 = *(long *)(in_RSI + 0x30);
    for (local_ac = 0; local_ac < iVar2; local_ac = local_ac + 1) {
      for (local_b0 = 0; local_b0 < iVar1; local_b0 = local_b0 + 1) {
        *(uint *)(fun + (long)local_b0 * 4) =
             (uint)*(byte *)(local_a8 + local_b0) * 0x1000 - *(int *)(fun + (long)local_b0 * 4);
      }
      fun = fun + (long)iVar1 * 4;
      local_a8 = local_a8 + *(int *)(in_RSI + 0x48);
    }
  }
  else {
    local_b8 = *(long *)(in_RSI + 0x30) << 1;
    for (local_bc = 0; local_bc < iVar2; local_bc = local_bc + 1) {
      for (local_c0 = 0; local_c0 < iVar1; local_c0 = local_c0 + 1) {
        *(uint *)(fun + (long)local_c0 * 4) =
             (uint)*(ushort *)(local_b8 + (long)local_c0 * 2) * 0x1000 -
             *(int *)(fun + (long)local_c0 * 4);
      }
      fun = fun + (long)iVar1 * 4;
      local_b8 = local_b8 + (long)*(int *)(in_RSI + 0x48) * 2;
    }
  }
  return;
}

Assistant:

static inline void calc_target_weighted_pred(
    const AV1_COMMON *cm, const MACROBLOCK *x, const MACROBLOCKD *xd,
    const uint8_t *above, int above_stride, const uint8_t *left,
    int left_stride) {
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;
  const int bw = xd->width << MI_SIZE_LOG2;
  const int bh = xd->height << MI_SIZE_LOG2;
  const OBMCBuffer *obmc_buffer = &x->obmc_buffer;
  int32_t *mask_buf = obmc_buffer->mask;
  int32_t *wsrc_buf = obmc_buffer->wsrc;

  const int is_hbd = is_cur_buf_hbd(xd);
  const int src_scale = AOM_BLEND_A64_MAX_ALPHA * AOM_BLEND_A64_MAX_ALPHA;

  // plane 0 should not be sub-sampled
  assert(xd->plane[0].subsampling_x == 0);
  assert(xd->plane[0].subsampling_y == 0);

  av1_zero_array(wsrc_buf, bw * bh);
  for (int i = 0; i < bw * bh; ++i) mask_buf[i] = AOM_BLEND_A64_MAX_ALPHA;

  // handle above row
  if (xd->up_available) {
    const int overlap =
        AOMMIN(block_size_high[bsize], block_size_high[BLOCK_64X64]) >> 1;
    struct calc_target_weighted_pred_ctxt ctxt = { obmc_buffer, above,
                                                   above_stride, overlap };
    foreach_overlappable_nb_above(cm, (MACROBLOCKD *)xd,
                                  max_neighbor_obmc[mi_size_wide_log2[bsize]],
                                  calc_target_weighted_pred_above, &ctxt);
  }

  for (int i = 0; i < bw * bh; ++i) {
    wsrc_buf[i] *= AOM_BLEND_A64_MAX_ALPHA;
    mask_buf[i] *= AOM_BLEND_A64_MAX_ALPHA;
  }

  // handle left column
  if (xd->left_available) {
    const int overlap =
        AOMMIN(block_size_wide[bsize], block_size_wide[BLOCK_64X64]) >> 1;
    struct calc_target_weighted_pred_ctxt ctxt = { obmc_buffer, left,
                                                   left_stride, overlap };
    foreach_overlappable_nb_left(cm, (MACROBLOCKD *)xd,
                                 max_neighbor_obmc[mi_size_high_log2[bsize]],
                                 calc_target_weighted_pred_left, &ctxt);
  }

  if (!is_hbd) {
    const uint8_t *src = x->plane[0].src.buf;

    for (int row = 0; row < bh; ++row) {
      for (int col = 0; col < bw; ++col) {
        wsrc_buf[col] = src[col] * src_scale - wsrc_buf[col];
      }
      wsrc_buf += bw;
      src += x->plane[0].src.stride;
    }
  } else {
    const uint16_t *src = CONVERT_TO_SHORTPTR(x->plane[0].src.buf);

    for (int row = 0; row < bh; ++row) {
      for (int col = 0; col < bw; ++col) {
        wsrc_buf[col] = src[col] * src_scale - wsrc_buf[col];
      }
      wsrc_buf += bw;
      src += x->plane[0].src.stride;
    }
  }
}